

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_truncatefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  int *piVar3;
  bool bVar4;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  undefined1 local_b8 [8];
  stat sbuf;
  int rval;
  int length;
  int fd;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    if ((*args & 0xfff0000) == 0xe0000) {
      local_bc = *args & 0xffff;
    }
    else {
      if ((*args & 0xfff0000) == 0xf0000) {
        local_c0 = *args | 0xffff0000;
      }
      else {
        pLVar2 = NativeAligned4FromLAddr(*args);
        local_c0 = *pLVar2;
      }
      local_bc = local_c0;
    }
    if ((args[1] & 0xfff0000) == 0xe0000) {
      local_c4 = args[1] & 0xffff;
    }
    else {
      if ((args[1] & 0xfff0000) == 0xf0000) {
        local_c8 = args[1] | 0xffff0000;
      }
      else {
        pLVar2 = NativeAligned4FromLAddr(args[1]);
        local_c8 = *pLVar2;
      }
      local_c4 = local_c8;
    }
    alarm(TIMEOUT_TIME);
    do {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sbuf.__glibc_reserved[2]._4_4_ = fstat(local_bc,(stat *)local_b8);
      bVar4 = false;
      if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    alarm(0);
    if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
      piVar3 = __errno_location();
      *Lisp_errno = *piVar3;
      args_local._4_4_ = 0;
    }
    else if (((uint)sbuf.st_nlink & 0xf000) == 0x8000) {
      if ((long)(int)local_c4 != sbuf.st_rdev) {
        alarm(TIMEOUT_TIME);
        do {
          piVar3 = __errno_location();
          *piVar3 = 0;
          sbuf.__glibc_reserved[2]._4_4_ = ftruncate(local_bc,(long)(int)local_c4);
          bVar4 = false;
          if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        alarm(0);
        if (sbuf.__glibc_reserved[2]._4_4_ != 0) {
          piVar3 = __errno_location();
          *Lisp_errno = *piVar3;
          return 0;
        }
        alarm(TIMEOUT_TIME);
        do {
          piVar3 = __errno_location();
          *piVar3 = 0;
          sbuf.__glibc_reserved[2]._4_4_ = fsync(local_bc);
          bVar4 = false;
          if (sbuf.__glibc_reserved[2]._4_4_ == -1) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        alarm(0);
        if (sbuf.__glibc_reserved[2]._4_4_ != 0) {
          piVar3 = __errno_location();
          *Lisp_errno = *piVar3;
          return 0;
        }
      }
      args_local._4_4_ = 0x4c;
    }
    else {
      args_local._4_4_ = 0x4c;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_truncatefile(LispPTR *args)
{
  int fd;
  int length;
  int rval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  fd = LispNumToCInt(args[0]);
  length = LispNumToCInt(args[1]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISREG(sbuf.st_mode)) {
    /*
     * The request file is not a regular file.  We don't need to
     * truncate such file.
     */
    return (ATOM_T);
  }
  if ((off_t)length != sbuf.st_size) {
#ifdef DOS
    TIMEOUT(rval = chsize(fd, (off_t)length));
#else
    TIMEOUT(rval = ftruncate(fd, (off_t)length));
#endif /* DOS */
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

/*
 * TRUNCATEFILE FDEV method is invoked from FORCEOUTPUT Lisp function.
 * Thus we have to sync the file state here.
 */
#ifndef DOS
    TIMEOUT(rval = fsync(fd));
#endif

    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }
  return (ATOM_T);
}